

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O1

bool __thiscall ON_V5x_DimStyle::CompareDimstyle(ON_V5x_DimStyle *this,ON_V5x_DimStyle *style)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ON_Font *pOVar5;
  ON_UUID *a;
  ON_UUID *b;
  
  iVar2 = ON_ModelComponent::CompareNameExact
                    (&this->super_ON_ModelComponent,&style->super_ON_ModelComponent);
  if (iVar2 == 0) {
    if ((this->m_extextension == style->m_extextension) &&
       (!NAN(this->m_extextension) && !NAN(style->m_extextension))) {
      if ((this->m_extoffset == style->m_extoffset) &&
         (!NAN(this->m_extoffset) && !NAN(style->m_extoffset))) {
        if ((this->m_arrowsize == style->m_arrowsize) &&
           (!NAN(this->m_arrowsize) && !NAN(style->m_arrowsize))) {
          if ((this->m_centermark == style->m_centermark) &&
             (!NAN(this->m_centermark) && !NAN(style->m_centermark))) {
            if ((this->m_textgap == style->m_textgap) &&
               (!NAN(this->m_textgap) && !NAN(style->m_textgap))) {
              if ((((this->m_textheight == style->m_textheight) &&
                   (((!NAN(this->m_textheight) && !NAN(style->m_textheight) &&
                     (this->m_dimstyle_textalign == style->m_dimstyle_textalign)) &&
                    (this->m_arrowtype == style->m_arrowtype)))) &&
                  (((this->m_angularunits == style->m_angularunits &&
                    (this->m_lengthformat == style->m_lengthformat)) &&
                   (this->m_angleformat == style->m_angleformat)))) &&
                 ((this->m_lengthresolution == style->m_lengthresolution &&
                  (this->m_angleresolution == style->m_angleresolution)))) {
                pOVar5 = ON_TextStyle::Font(&this->m_v5_text_style);
                uVar3 = ON_Font::ManagedFontSerialNumber(pOVar5);
                pOVar5 = ON_TextStyle::Font(&style->m_v5_text_style);
                uVar4 = ON_Font::ManagedFontSerialNumber(pOVar5);
                if (uVar3 == uVar4) {
                  if (((this->m_lengthfactor == style->m_lengthfactor) &&
                      (!NAN(this->m_lengthfactor) && !NAN(style->m_lengthfactor))) &&
                     (this->m_bAlternate == style->m_bAlternate)) {
                    if ((((this->m_alternate_lengthfactor == style->m_alternate_lengthfactor) &&
                         (!NAN(this->m_alternate_lengthfactor) &&
                          !NAN(style->m_alternate_lengthfactor))) &&
                        ((this->m_alternate_lengthformat == style->m_alternate_lengthformat &&
                         ((this->m_alternate_lengthresolution == style->m_alternate_lengthresolution
                          && (this->m_alternate_angleformat == style->m_alternate_angleformat))))))
                       && ((this->m_alternate_angleresolution == style->m_alternate_angleresolution
                           && ((((bVar1 = ::operator==(&this->m_prefix,&style->m_prefix), bVar1 &&
                                 (bVar1 = ::operator==(&this->m_suffix,&style->m_suffix), bVar1)) &&
                                (bVar1 = ::operator==(&this->m_alternate_prefix,
                                                      &style->m_alternate_prefix), bVar1)) &&
                               (bVar1 = ::operator==(&this->m_alternate_suffix,
                                                     &style->m_alternate_suffix), bVar1)))))) {
                      if ((this->m_dimextension == style->m_dimextension) &&
                         (!NAN(this->m_dimextension) && !NAN(style->m_dimextension))) {
                        if ((((this->m_leaderarrowsize == style->m_leaderarrowsize) &&
                             ((!NAN(this->m_leaderarrowsize) && !NAN(style->m_leaderarrowsize) &&
                              (this->m_leaderarrowtype == style->m_leaderarrowtype)))) &&
                            (this->m_bSuppressExtension1 == style->m_bSuppressExtension1)) &&
                           (this->m_bSuppressExtension2 == style->m_bSuppressExtension2)) {
                          a = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
                          b = ON_ModelComponent::ParentId(&style->super_ON_ModelComponent);
                          bVar1 = ::operator==(a,b);
                          if ((((bVar1) &&
                               (bVar1 = ::operator==(&this->m_source_dimstyle,
                                                     &style->m_source_dimstyle), bVar1)) &&
                              (this->m_tolerance_style == style->m_tolerance_style)) &&
                             (this->m_tolerance_resolution == style->m_tolerance_resolution)) {
                            if ((this->m_tolerance_upper_value == style->m_tolerance_upper_value) &&
                               (!NAN(this->m_tolerance_upper_value) &&
                                !NAN(style->m_tolerance_upper_value))) {
                              if ((this->m_tolerance_lower_value == style->m_tolerance_lower_value)
                                 && (!NAN(this->m_tolerance_lower_value) &&
                                     !NAN(style->m_tolerance_lower_value))) {
                                if ((this->m_tolerance_height_scale ==
                                     style->m_tolerance_height_scale) &&
                                   (!NAN(this->m_tolerance_height_scale) &&
                                    !NAN(style->m_tolerance_height_scale))) {
                                  if ((this->m_baseline_spacing == style->m_baseline_spacing) &&
                                     (((!NAN(this->m_baseline_spacing) &&
                                        !NAN(style->m_baseline_spacing) &&
                                       (this->m_bDrawMask == style->m_bDrawMask)) &&
                                      (this->m_mask_color_source == style->m_mask_color_source)))) {
                                    uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                      (&this->m_mask_color);
                                    uVar4 = ON_Color::operator_cast_to_unsigned_int
                                                      (&style->m_mask_color);
                                    if (uVar3 == uVar4) {
                                      if (((((this->m_dimscale == style->m_dimscale) &&
                                            (!NAN(this->m_dimscale) && !NAN(style->m_dimscale))) &&
                                           ((this->m_dimscale_source == style->m_dimscale_source &&
                                            ((this->m_ext_line_color_source ==
                                              style->m_ext_line_color_source &&
                                             (this->m_dim_line_color_source ==
                                              style->m_dim_line_color_source)))))) &&
                                          (this->m_arrow_color_source == style->m_arrow_color_source
                                          )) && (this->m_text_color_source ==
                                                 style->m_text_color_source)) {
                                        uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                          (&this->m_ext_line_color);
                                        uVar4 = ON_Color::operator_cast_to_unsigned_int
                                                          (&style->m_ext_line_color);
                                        if (uVar3 == uVar4) {
                                          uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                            (&this->m_dim_line_color);
                                          uVar4 = ON_Color::operator_cast_to_unsigned_int
                                                            (&style->m_dim_line_color);
                                          if (uVar3 == uVar4) {
                                            uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                              (&this->m_arrow_color);
                                            uVar4 = ON_Color::operator_cast_to_unsigned_int
                                                              (&style->m_arrow_color);
                                            if (uVar3 == uVar4) {
                                              uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                                (&this->m_text_color);
                                              uVar4 = ON_Color::operator_cast_to_unsigned_int
                                                                (&style->m_text_color);
                                              if ((((uVar3 == uVar4) &&
                                                   (this->m_ext_line_plot_color_source ==
                                                    style->m_ext_line_plot_color_source)) &&
                                                  (this->m_dim_line_plot_color_source ==
                                                   style->m_dim_line_plot_color_source)) &&
                                                 ((this->m_arrow_plot_color_source ==
                                                   style->m_arrow_plot_color_source &&
                                                  (this->m_text_plot_color_source ==
                                                   style->m_text_plot_color_source)))) {
                                                uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                                  (&this->m_ext_line_plot_color);
                                                uVar4 = ON_Color::operator_cast_to_unsigned_int
                                                                  (&style->m_ext_line_plot_color);
                                                if (uVar3 == uVar4) {
                                                  uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                                    (&this->m_dim_line_plot_color);
                                                  uVar4 = ON_Color::operator_cast_to_unsigned_int
                                                                    (&style->m_dim_line_plot_color);
                                                  if (uVar3 == uVar4) {
                                                    uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                                      (&this->m_arrow_plot_color);
                                                    uVar4 = ON_Color::operator_cast_to_unsigned_int
                                                                      (&style->m_arrow_plot_color);
                                                    if (uVar3 == uVar4) {
                                                      uVar3 = ON_Color::
                                                              operator_cast_to_unsigned_int
                                                                        (&this->m_text_plot_color);
                                                      uVar4 = ON_Color::
                                                              operator_cast_to_unsigned_int
                                                                        (&style->m_text_plot_color);
                                                      if (((uVar3 == uVar4) &&
                                                          (this->m_ext_line_plot_weight_source ==
                                                           style->m_ext_line_plot_weight_source)) &&
                                                         (this->m_dim_line_plot_weight_source ==
                                                          style->m_dim_line_plot_weight_source)) {
                                                        if ((this->m_ext_line_plot_weight_mm ==
                                                             style->m_ext_line_plot_weight_mm) &&
                                                           (!NAN(this->m_ext_line_plot_weight_mm) &&
                                                            !NAN(style->m_ext_line_plot_weight_mm)))
                                                        {
                                                          if ((this->m_dim_line_plot_weight_mm ==
                                                               style->m_dim_line_plot_weight_mm) &&
                                                             (!NAN(this->m_dim_line_plot_weight_mm)
                                                              && !NAN(style->
                                                  m_dim_line_plot_weight_mm))) {
                                                    if (((this->m_fixed_extension_len ==
                                                          style->m_fixed_extension_len) &&
                                                        (!NAN(this->m_fixed_extension_len) &&
                                                         !NAN(style->m_fixed_extension_len))) &&
                                                       (this->m_fixed_extension_len_on ==
                                                        style->m_fixed_extension_len_on)) {
                                                      if (((((this->m_text_rotation ==
                                                              style->m_text_rotation) &&
                                                            (!NAN(this->m_text_rotation) &&
                                                             !NAN(style->m_text_rotation))) &&
                                                           (this->m_alt_tol_resolution ==
                                                            style->m_alt_tol_resolution)) &&
                                                          ((this->m_suppress_arrow1 ==
                                                            style->m_suppress_arrow1 &&
                                                           (this->m_suppress_arrow2 ==
                                                            style->m_suppress_arrow2)))) &&
                                                         ((this->m_textmove_leader ==
                                                           style->m_textmove_leader &&
                                                          (this->m_arclength_sym ==
                                                           style->m_arclength_sym)))) {
                                                        if (((this->m_stack_textheight_fraction ==
                                                              style->m_stack_textheight_fraction) &&
                                                            (!NAN(this->m_stack_textheight_fraction)
                                                             && !NAN(style->
                                                  m_stack_textheight_fraction))) &&
                                                  (this->m_stack_format == style->m_stack_format)) {
                                                    if ((this->m_alt_round == style->m_alt_round) &&
                                                       (!NAN(this->m_alt_round) &&
                                                        !NAN(style->m_alt_round))) {
                                                      if ((this->m_round == style->m_round) &&
                                                         (((!NAN(this->m_round) &&
                                                            !NAN(style->m_round) &&
                                                           (this->m_alt_zero_suppress ==
                                                            style->m_alt_zero_suppress)) &&
                                                          ((this->m_tol_zero_suppress ==
                                                            style->m_tol_zero_suppress &&
                                                           ((((this->m_zero_suppress ==
                                                               style->m_zero_suppress &&
                                                              (this->m_ang_zero_suppress ==
                                                               style->m_ang_zero_suppress)) &&
                                                             (bVar1 = ON_Arrowhead::operator==
                                                                                (&this->m_arrow_1,
                                                                                 &style->m_arrow_1),
                                                             bVar1)) &&
                                                            ((bVar1 = ON_Arrowhead::operator==
                                                                                (&this->m_arrow_2,
                                                                                 &style->m_arrow_2),
                                                             bVar1 && (bVar1 = CompareValidFields(
                                                  this,style), bVar1)))))))))) {
                                                    return true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_V5x_DimStyle::CompareDimstyle(const ON_V5x_DimStyle& style) const
{
  if (
    0 == ON_ModelComponent::CompareNameExact(*this,style) &&
    m_extextension == style.m_extextension &&
    m_extoffset == style.m_extoffset &&
    m_arrowsize == style.m_arrowsize &&
    m_centermark == style.m_centermark &&
    m_textgap == style.m_textgap &&
    m_textheight == style.m_textheight &&
    m_dimstyle_textalign == style.m_dimstyle_textalign &&
    m_arrowtype == style.m_arrowtype &&
    m_angularunits == style.m_angularunits &&
    m_lengthformat == style.m_lengthformat &&
    m_angleformat == style.m_angleformat &&
    m_lengthresolution == style.m_lengthresolution &&
    m_angleresolution == style.m_angleresolution &&
    m_v5_text_style.Font().ManagedFontSerialNumber() == style.m_v5_text_style.Font().ManagedFontSerialNumber() &&
    //ON_TextStyle::EqualTextStyleFontAndName(m_text_style, style.m_text_style) &&
    m_lengthfactor == style.m_lengthfactor &&
    m_bAlternate == style.m_bAlternate &&
    m_alternate_lengthfactor == style.m_alternate_lengthfactor &&
    m_alternate_lengthformat == style.m_alternate_lengthformat &&
    m_alternate_lengthresolution == style.m_alternate_lengthresolution &&
    m_alternate_angleformat == style.m_alternate_angleformat &&
    m_alternate_angleresolution == style.m_alternate_angleresolution &&

    m_prefix == style.m_prefix &&
    m_suffix == style.m_suffix &&
    m_alternate_prefix == style.m_alternate_prefix &&
    m_alternate_suffix == style.m_alternate_suffix &&

    m_dimextension == style.m_dimextension &&

    m_leaderarrowsize == style.m_leaderarrowsize &&
    m_leaderarrowtype == style.m_leaderarrowtype &&
    m_bSuppressExtension1 == style.m_bSuppressExtension1 &&
    m_bSuppressExtension2 == style.m_bSuppressExtension2 &&

    ParentId() == style.ParentId() &&
    m_source_dimstyle == style.m_source_dimstyle &&

    m_tolerance_style == style.m_tolerance_style &&
    m_tolerance_resolution == style.m_tolerance_resolution &&
    m_tolerance_upper_value == style.m_tolerance_upper_value &&
    m_tolerance_lower_value == style.m_tolerance_lower_value &&
    m_tolerance_height_scale == style.m_tolerance_height_scale &&
    m_baseline_spacing == style.m_baseline_spacing &&
    m_bDrawMask == style.m_bDrawMask &&
    m_mask_color_source == style.m_mask_color_source &&
    m_mask_color == style.m_mask_color &&
    m_dimscale == style.m_dimscale &&
    m_dimscale_source == style.m_dimscale_source &&

    m_ext_line_color_source == style.m_ext_line_color_source &&
    m_dim_line_color_source == style.m_dim_line_color_source &&
    m_arrow_color_source == style.m_arrow_color_source &&
    m_text_color_source == style.m_text_color_source &&
    m_ext_line_color == style.m_ext_line_color &&
    m_dim_line_color == style.m_dim_line_color &&
    m_arrow_color == style.m_arrow_color &&
    m_text_color == style.m_text_color &&
    m_ext_line_plot_color_source == style.m_ext_line_plot_color_source &&
    m_dim_line_plot_color_source == style.m_dim_line_plot_color_source &&
    m_arrow_plot_color_source == style.m_arrow_plot_color_source &&
    m_text_plot_color_source == style.m_text_plot_color_source &&
    m_ext_line_plot_color == style.m_ext_line_plot_color &&
    m_dim_line_plot_color == style.m_dim_line_plot_color &&
    m_arrow_plot_color == style.m_arrow_plot_color &&
    m_text_plot_color == style.m_text_plot_color &&
    m_ext_line_plot_weight_source == style.m_ext_line_plot_weight_source &&
    m_dim_line_plot_weight_source == style.m_dim_line_plot_weight_source &&
    m_ext_line_plot_weight_mm == style.m_ext_line_plot_weight_mm &&
    m_dim_line_plot_weight_mm == style.m_dim_line_plot_weight_mm &&

    m_fixed_extension_len == style.m_fixed_extension_len &&
    m_fixed_extension_len_on == style.m_fixed_extension_len_on &&
    m_text_rotation == style.m_text_rotation &&
    m_alt_tol_resolution == style.m_alt_tol_resolution &&
    m_suppress_arrow1 == style.m_suppress_arrow1 &&
    m_suppress_arrow2 == style.m_suppress_arrow2 &&
    m_textmove_leader == style.m_textmove_leader &&
    m_arclength_sym == style.m_arclength_sym &&
    m_stack_textheight_fraction == style.m_stack_textheight_fraction &&
    m_stack_format == style.m_stack_format &&
    m_alt_round == style.m_alt_round &&
    m_round == style.m_round &&
    m_alt_zero_suppress == style.m_alt_zero_suppress &&
    m_tol_zero_suppress == style.m_tol_zero_suppress &&
    m_zero_suppress == style.m_zero_suppress &&
    m_ang_zero_suppress == style.m_ang_zero_suppress &&

    //m_arrow_type_1 == style.m_arrow_type_1 &&
    //m_arrow_type_2 == style.m_arrow_type_2 &&
    //m_dim_arrow_block1 == style.m_dim_arrow_block1 &&
    //m_dim_arrow_block2 == style.m_dim_arrow_block2 &&

    m_arrow_1 == style.m_arrow_1 &&
    m_arrow_2 == style.m_arrow_2 &&


    CompareValidFields(style)
    )
    return true;
  else
    return false;
}